

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_opengl.c
# Opt level: O0

void impl_ARB1_PushUniforms(void)

{
  uint uVar1;
  MOJOSHADER_shaderType MVar2;
  MOJOSHADER_uniformType MVar3;
  MOJOSHADER_glProgram *pMVar4;
  MOJOSHADER_uniform *pMVar5;
  GLuint GVar6;
  GLfloat local_e0;
  int local_dc;
  GLfloat *local_d8;
  GLfloat *srcf_1;
  GLfloat local_c8;
  GLenum target;
  GLfloat fv_1 [4];
  GLfloat local_a8;
  GLfloat fb;
  GLint iv [4];
  int local_8c;
  GLint ib;
  int i_3;
  GLfloat fv [4];
  int local_70;
  int local_6c;
  int i_2;
  int i_1;
  int size;
  MOJOSHADER_uniformType type;
  MOJOSHADER_uniform *u;
  MOJOSHADER_shaderType uniform_shader_type;
  UniformMap *map;
  uint32 local_40;
  uint32 i;
  GLint texbem_loc;
  GLint loc;
  GLint *srcb;
  GLint *srci;
  GLfloat *srcf;
  uint32 count;
  MOJOSHADER_glProgram *program;
  GLenum arb_shader_type;
  MOJOSHADER_shaderType shader_type;
  
  program._4_4_ = MOJOSHADER_TYPE_VERTEX;
  program._0_4_ = arb1_shader_type(MOJOSHADER_TYPE_VERTEX);
  pMVar4 = ctx->bound_program;
  uVar1 = pMVar4->uniform_count;
  srci = (GLint *)pMVar4->vs_uniforms_float4;
  srcb = pMVar4->vs_uniforms_int4;
  _texbem_loc = pMVar4->vs_uniforms_bool;
  i = 0;
  local_40 = 0;
  if (uVar1 == 0) {
    __assert_fail("count > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                  ,0x327,"void impl_ARB1_PushUniforms(void)");
  }
  map._4_4_ = 0;
  while( true ) {
    if (uVar1 <= map._4_4_) {
      if (pMVar4->texbem_count != 0) {
        local_d8 = pMVar4->ps_uniforms_float4 +
                   (pMVar4->ps_uniforms_float4_count * 4 - (ulong)(pMVar4->texbem_count << 3));
        i = local_40;
        for (map._4_4_ = 0; map._4_4_ < pMVar4->texbem_count; map._4_4_ = map._4_4_ + 1) {
          GVar6 = i + 1;
          (*ctx->glProgramLocalParameter4fvARB)(0x8804,i,local_d8);
          i = i + 2;
          (*ctx->glProgramLocalParameter4fvARB)(0x8804,GVar6,local_d8 + 4);
          local_d8 = local_d8 + 8;
        }
      }
      return;
    }
    MVar2 = pMVar4->uniforms[map._4_4_].shader_type;
    pMVar5 = pMVar4->uniforms[map._4_4_].uniform;
    MVar3 = pMVar5->type;
    if (pMVar5->array_count == 0) {
      local_dc = 1;
    }
    else {
      local_dc = pMVar5->array_count;
    }
    if (pMVar5->constant != 0) break;
    if (program._4_4_ != MVar2) {
      if (program._4_4_ == MOJOSHADER_TYPE_PIXEL) {
        local_40 = i;
      }
      if (MVar2 != MOJOSHADER_TYPE_PIXEL) {
        __assert_fail("0 && \"Unexpected shader type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x346,"void impl_ARB1_PushUniforms(void)");
      }
      if (program._4_4_ != MOJOSHADER_TYPE_VERTEX) {
        __assert_fail("shader_type == MOJOSHADER_TYPE_VERTEX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                      ,0x33d,"void impl_ARB1_PushUniforms(void)");
      }
      srci = (GLint *)pMVar4->ps_uniforms_float4;
      srcb = pMVar4->ps_uniforms_int4;
      _texbem_loc = pMVar4->ps_uniforms_bool;
      i = 0;
      program._0_4_ = arb1_shader_type(MOJOSHADER_TYPE_PIXEL);
      program._4_4_ = MOJOSHADER_TYPE_PIXEL;
    }
    if (MVar3 == MOJOSHADER_UNIFORM_FLOAT) {
      for (local_6c = 0; local_6c < local_dc; local_6c = local_6c + 1) {
        (*ctx->glProgramLocalParameter4fvARB)((GLenum)program,i,(GLfloat *)srci);
        srci = srci + 4;
        i = i + 1;
      }
    }
    else if (MVar3 == MOJOSHADER_UNIFORM_INT) {
      if (ctx->have_GL_NV_gpu_program4 == 0) {
        for (local_70 = 0; local_70 < local_dc; local_70 = local_70 + 1) {
          ib = (GLint)(float)*srcb;
          i_3 = (int)(float)srcb[1];
          fv[0] = (GLfloat)srcb[2];
          fv[1] = (GLfloat)srcb[3];
          (*ctx->glProgramLocalParameter4fvARB)((GLenum)program,i,(GLfloat *)&ib);
          srcb = srcb + 4;
          i = i + 1;
        }
      }
      else {
        for (local_70 = 0; local_70 < local_dc; local_70 = local_70 + 1) {
          (*ctx->glProgramLocalParameterI4ivNV)((GLenum)program,i,srcb);
          srcb = srcb + 4;
          i = i + 1;
        }
      }
    }
    else if (MVar3 == MOJOSHADER_UNIFORM_BOOL) {
      if (ctx->have_GL_NV_gpu_program4 == 0) {
        for (local_8c = 0; local_8c < local_dc; local_8c = local_8c + 1) {
          local_e0 = 1.0;
          if (*_texbem_loc == 0) {
            local_e0 = 0.0;
          }
          local_c8 = local_e0;
          target = (GLenum)local_e0;
          fv_1[0] = local_e0;
          fv_1[1] = local_e0;
          (*ctx->glProgramLocalParameter4fvARB)((GLenum)program,i,&local_c8);
          _texbem_loc = _texbem_loc + 1;
          i = i + 1;
        }
      }
      else {
        for (local_8c = 0; local_8c < local_dc; local_8c = local_8c + 1) {
          local_a8 = (GLfloat)(uint)(*_texbem_loc != 0);
          fb = local_a8;
          iv[0] = (GLint)local_a8;
          iv[1] = (GLint)local_a8;
          (*ctx->glProgramLocalParameterI4ivNV)((GLenum)program,i,(GLint *)&local_a8);
          _texbem_loc = _texbem_loc + 1;
          i = i + 1;
        }
      }
    }
    map._4_4_ = map._4_4_ + 1;
  }
  __assert_fail("!u->constant",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_opengl.c"
                ,0x331,"void impl_ARB1_PushUniforms(void)");
}

Assistant:

static void impl_ARB1_PushUniforms(void)
{
    // vertex shader uniforms come first in program->uniforms array.
    MOJOSHADER_shaderType shader_type = MOJOSHADER_TYPE_VERTEX;
    GLenum arb_shader_type = arb1_shader_type(shader_type);
    const MOJOSHADER_glProgram *program = ctx->bound_program;
    const uint32 count = program->uniform_count;
    const GLfloat *srcf = program->vs_uniforms_float4;
    const GLint *srci = program->vs_uniforms_int4;
    const GLint *srcb = program->vs_uniforms_bool;
    GLint loc = 0;
    GLint texbem_loc = 0;
    uint32 i;

    assert(count > 0);  // shouldn't call this with nothing to do!

    for (i = 0; i < count; i++)
    {
        UniformMap *map = &program->uniforms[i];
        const MOJOSHADER_shaderType uniform_shader_type = map->shader_type;
        const MOJOSHADER_uniform *u = map->uniform;
        const MOJOSHADER_uniformType type = u->type;
        const int size = u->array_count ? u->array_count : 1;

        assert(!u->constant);

        // Did we switch from vertex to pixel (to geometry, etc)?
        if (shader_type != uniform_shader_type)
        {
            if (shader_type == MOJOSHADER_TYPE_PIXEL)
                texbem_loc = loc;

            // we start with vertex, move to pixel, then to geometry, etc.
            //  The array should always be sorted as such.
            if (uniform_shader_type == MOJOSHADER_TYPE_PIXEL)
            {
                assert(shader_type == MOJOSHADER_TYPE_VERTEX);
                srcf = program->ps_uniforms_float4;
                srci = program->ps_uniforms_int4;
                srcb = program->ps_uniforms_bool;
                loc = 0;
            } // if
            else
            {
                // These should be ordered vertex, then pixel, then geometry.
                assert(0 && "Unexpected shader type");
            } // else

            shader_type = uniform_shader_type;
            arb_shader_type = arb1_shader_type(uniform_shader_type);
        } // if

        if (type == MOJOSHADER_UNIFORM_FLOAT)
        {
            int i;
            for (i = 0; i < size; i++, srcf += 4, loc++)
                ctx->glProgramLocalParameter4fvARB(arb_shader_type, loc, srcf);
        } // if
        else if (type == MOJOSHADER_UNIFORM_INT)
        {
            int i;
            if (ctx->have_GL_NV_gpu_program4)
            {
                // GL_NV_gpu_program4 has integer uniform loading support.
                for (i = 0; i < size; i++, srci += 4, loc++)
                    ctx->glProgramLocalParameterI4ivNV(arb_shader_type, loc, srci);
            } // if
            else
            {
                for (i = 0; i < size; i++, srci += 4, loc++)
                {
                    const GLfloat fv[4] = {
                        (GLfloat) srci[0], (GLfloat) srci[1],
                        (GLfloat) srci[2], (GLfloat) srci[3]
                    };
                    ctx->glProgramLocalParameter4fvARB(arb_shader_type, loc, fv);
                } // for
            } // else
        } // else if
        else if (type == MOJOSHADER_UNIFORM_BOOL)
        {
            int i;
            if (ctx->have_GL_NV_gpu_program4)
            {
                // GL_NV_gpu_program4 has integer uniform loading support.
                for (i = 0; i < size; i++, srcb++, loc++)
                {
                    const GLint ib = (GLint) ((*srcb) ? 1 : 0);
                    const GLint iv[4] = { ib, ib, ib, ib };
                    ctx->glProgramLocalParameterI4ivNV(arb_shader_type, loc, iv);
                } // for
            } // if
            else
            {
                for (i = 0; i < size; i++, srcb++, loc++)
                {
                    const GLfloat fb = (GLfloat) ((*srcb) ? 1.0f : 0.0f);
                    const GLfloat fv[4] = { fb, fb, fb, fb };
                    ctx->glProgramLocalParameter4fvARB(arb_shader_type, loc, fv);
                } // for
            } // else
        } // else if
    } // for

    if (program->texbem_count)
    {
        const GLenum target = GL_FRAGMENT_PROGRAM_ARB;
        GLfloat *srcf = program->ps_uniforms_float4;
        srcf += (program->ps_uniforms_float4_count * 4) -
                (program->texbem_count * 8);
        loc = texbem_loc;
        for (i = 0; i < program->texbem_count; i++, srcf += 8)
        {
            ctx->glProgramLocalParameter4fvARB(target, loc++, srcf);
            ctx->glProgramLocalParameter4fvARB(target, loc++, srcf + 4);
        } // for
    } // if
}